

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O1

err_t brngHMACRand(void *buf,size_t count,octet *key,size_t key_len,octet *iv,size_t iv_len)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t state;
  err_t eVar3;
  
  bVar1 = memIsValid(key,key_len);
  eVar3 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(iv,iv_len);
    if (bVar1 != 0) {
      bVar1 = memIsValid(buf,count);
      if (bVar1 == 0) {
        eVar3 = 0x6d;
      }
      else {
        bVar1 = memIsDisjoint2(buf,count,iv,iv_len);
        eVar3 = 0x6d;
        if (bVar1 != 0) {
          eVar3 = 0;
          sVar2 = beltHMAC_keep();
          state = blobCreate(sVar2 * 2 + 0x98);
          if (state == (blob_t)0x0) {
            eVar3 = 0x6e;
          }
          else {
            brngHMACStart(state,key,key_len,iv,iv_len);
            brngHMACStepR(buf,count,state);
            blobClose(state);
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t brngHMACRand(void* buf, size_t count, const octet key[], size_t key_len,
	const octet iv[], size_t iv_len)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(key, key_len) ||
		!memIsValid(iv, iv_len) ||
		!memIsValid(buf, count) ||
		!memIsDisjoint2(buf, count, iv, iv_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(brngHMAC_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать данные
	brngHMACStart(state, key, key_len, iv, iv_len);
	brngHMACStepR(buf, count, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}